

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ScalarReplacementPass::CreateVariable
          (ScalarReplacementPass *this,uint32_t type_id,Instruction *var_inst,uint32_t index,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *c;
  uint32_t ty_id;
  uint32_t res_id;
  Instruction *pIVar1;
  BasicBlock *block;
  DefUseManager *this_00;
  initializer_list<unsigned_int> init_list;
  uint local_ac;
  Instruction *inst;
  SmallVector<unsigned_int,_2UL> local_a0;
  Instruction *local_78;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ty_id = GetOrCreatePointerType(this,type_id);
  res_id = Pass::TakeNextId((Pass *)this);
  if (res_id == 0) {
    inst = (Instruction *)0x0;
    std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    emplace_back<spvtools::opt::Instruction*>
              ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               replacements,&inst);
  }
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = (this->super_MemPass).super_Pass.context_;
  local_ac = 7;
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  inst = (Instruction *)CONCAT44(inst._4_4_,0x11);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_70);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &inst,&local_78);
  Instruction::Instruction(pIVar1,c,OpVariable,ty_id,res_id,(OperandList *)&local_48);
  local_78 = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  block = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,var_inst);
  inst = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
         super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_70,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&inst);
  pIVar1 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  inst = pIVar1;
  GetOrCreateInitialValue(this,var_inst,index,pIVar1);
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,pIVar1);
  IRContext::set_instr_block((this->super_MemPass).super_Pass.context_,pIVar1,block);
  CopyDecorationsToVariable(this,var_inst,pIVar1,index);
  Instruction::UpdateDebugInfoFrom(pIVar1,var_inst);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_back(replacements,&inst);
  if (local_78 != (Instruction *)0x0) {
    (*(local_78->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
  }
  return;
}

Assistant:

void ScalarReplacementPass::CreateVariable(
    uint32_t type_id, Instruction* var_inst, uint32_t index,
    std::vector<Instruction*>* replacements) {
  uint32_t ptr_id = GetOrCreatePointerType(type_id);
  uint32_t id = TakeNextId();

  if (id == 0) {
    replacements->push_back(nullptr);
  }

  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {uint32_t(spv::StorageClass::Function)}}}));

  BasicBlock* block = context()->get_instr_block(var_inst);
  block->begin().InsertBefore(std::move(variable));
  Instruction* inst = &*block->begin();

  // If varInst was initialized, make sure to initialize its replacement.
  GetOrCreateInitialValue(var_inst, index, inst);
  get_def_use_mgr()->AnalyzeInstDefUse(inst);
  context()->set_instr_block(inst, block);

  CopyDecorationsToVariable(var_inst, inst, index);
  inst->UpdateDebugInfoFrom(var_inst);

  replacements->push_back(inst);
}